

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsParseModuleSource(JsModuleRecord requestModule,JsSourceContext sourceContext,byte *sourceText,
                   uint sourceLength,JsParseModuleSourceFlags sourceFlag,
                   JsValueRef *exceptionValueRef)

{
  ScriptContext *this;
  Var aValue;
  int iVar1;
  charcount_t cVar2;
  HRESULT HVar3;
  SourceTextModuleRecord *this_00;
  JavascriptString *this_01;
  undefined4 extraout_var;
  size_t len;
  JsErrorCode JVar4;
  SRCINFO local_a0;
  AutoNestedHandledExceptionType local_78 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  char16 *url;
  
  JVar4 = JsErrorNullArgument;
  if (((exceptionValueRef != (JsValueRef *)0x0 && requestModule != (JsModuleRecord)0x0) &&
      (JVar4 = JsErrorInvalidArgument, (int)sourceFlag < 2)) &&
     (*exceptionValueRef = (JsValueRef)0x0, *(int *)((long)requestModule + 8) == 0x65646f4d)) {
    this_00 = Js::SourceTextModuleRecord::FromHost(requestModule);
    JVar4 = JsErrorModuleParsed;
    if (this_00->wasParsed == false) {
      this = (this_00->scriptContext).ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_78,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      local_a0.sourceContextInfo.ptr =
           Js::ScriptContext::GetSourceContextInfo(this,sourceContext,(SimpleDataCacheWrapper *)0x0)
      ;
      if (local_a0.sourceContextInfo.ptr == (SourceContextInfo *)0x0) {
        aValue = (this_00->normalizedSpecifier).ptr;
        if (aValue == (Var)0x0) {
          url = (char16 *)0x0;
          len = 0;
        }
        else {
          this_01 = Js::VarTo<Js::JavascriptString>(aValue);
          iVar1 = (*(this_01->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(this_01);
          url = (char16 *)CONCAT44(extraout_var,iVar1);
          cVar2 = Js::JavascriptString::GetLength(this_01);
          len = (size_t)cVar2;
        }
        local_a0.sourceContextInfo.ptr =
             Js::ScriptContext::CreateSourceContextInfo
                       (this,sourceContext,url,len,(SimpleDataCacheWrapper *)0x0,(char16 *)0x0,0);
      }
      Memory::Recycler::WBSetBit((char *)&local_a0);
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_a0);
      local_a0.dlnHost = 0;
      local_a0.ulColumnHost = 0;
      local_a0.lnMinHost = 0;
      local_a0.ichMinHost = 0;
      local_a0.ulCharOffset = 0;
      local_a0.moduleID = 0;
      local_a0.grfsi = 0;
      local_a0.ichLimHost = sourceLength;
      HVar3 = Js::SourceTextModuleRecord::ParseSource
                        (this_00,sourceText,sourceLength,&local_a0,exceptionValueRef,
                         sourceFlag == JsParseModuleSourceFlags_DataIsUTF8);
      JVar4 = HVar3 >> 0x1f & JsErrorScriptCompile;
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_78);
    }
  }
  return JVar4;
}

Assistant:

CHAKRA_API
JsParseModuleSource(
    _In_ JsModuleRecord requestModule,
    _In_ JsSourceContext sourceContext,
    _In_ byte* sourceText,
    _In_ unsigned int sourceLength,
    _In_ JsParseModuleSourceFlags sourceFlag,
    _Outptr_result_maybenull_ JsValueRef* exceptionValueRef)
{
    PARAM_NOT_NULL(requestModule);
    PARAM_NOT_NULL(exceptionValueRef);
    if (sourceFlag > JsParseModuleSourceFlags_DataIsUTF8)
    {
        return JsErrorInvalidArgument;
    }

    *exceptionValueRef = JS_INVALID_REFERENCE;
    HRESULT hr;
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        return JsErrorInvalidArgument;
    }
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    if (moduleRecord->WasParsed())
    {
        return JsErrorModuleParsed;
    }
    Js::ScriptContext* scriptContext = moduleRecord->GetScriptContext();
    JsErrorCode errorCode = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        SourceContextInfo* sourceContextInfo = scriptContext->GetSourceContextInfo(sourceContext, nullptr);
        if (sourceContextInfo == nullptr)
        {
            const char16 *moduleUrlSz = nullptr;
            size_t moduleUrlLen = 0;
            if (moduleRecord->GetSpecifier())
            {
                Js::JavascriptString *moduleUrl = Js::VarTo<Js::JavascriptString>(moduleRecord->GetSpecifier());
                moduleUrlSz = moduleUrl->GetSz();
                moduleUrlLen = moduleUrl->GetLength();
            }
            sourceContextInfo = scriptContext->CreateSourceContextInfo(sourceContext, moduleUrlSz, moduleUrlLen, nullptr, nullptr, 0);
        }
        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(sourceLength),
            /* ulCharOffset        */ 0,
            /* mod                 */ 0,
            /* grfsi               */ 0
        };
        hr = moduleRecord->ParseSource(sourceText, sourceLength, &si, exceptionValueRef, sourceFlag == JsParseModuleSourceFlags_DataIsUTF8 ? true : false);
        if (FAILED(hr))
        {
            return JsErrorScriptCompile;
        }
        return JsNoError;
    });
    return errorCode;
}